

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_resolver.cpp
# Opt level: O1

void __thiscall
cpptrace::detail::libdwarf::dwarf_resolver::get_inlines_info
          (dwarf_resolver *this,die_object *cu_die,die_object *die,Dwarf_Addr pc,
          Dwarf_Half dwversion,
          vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *inlines)

{
  Dwarf_Die pDVar1;
  Dwarf_Half DVar2;
  char *signature;
  char *expression;
  assert_type type;
  ulong uVar3;
  byte bVar4;
  source_location location;
  die_object current_obj_holder;
  optional<std::reference_wrapper<const_cpptrace::detail::libdwarf::die_object>,_0> target_die;
  die_object child;
  char *in_stack_ffffffffffffff58;
  die_object local_98;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  die_object *local_68;
  Dwarf_Addr local_60;
  vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> *local_58;
  undefined1 local_50 [8];
  byte local_48;
  die_object local_40;
  
  local_68 = cu_die;
  local_60 = pc;
  local_58 = inlines;
  DVar2 = die_object::get_tag(die);
  if ((DVar2 == 0x2e) || (DVar2 = die_object::get_tag(die), DVar2 == 0x1d)) {
    local_98.dbg = this->dbg;
    local_98.die = (Dwarf_Die)0x0;
    if (local_98.dbg != (Dwarf_Debug)0x0) {
      bVar4 = 1;
      do {
        if ((bVar4 & 1) == 0) break;
        die_object::get_child(&local_40);
        pDVar1 = local_40.die;
        if (local_40.die != (Dwarf_Die)0x0) {
          local_48 = 0;
          local_78 = (code *)0x0;
          pcStack_70 = (code *)0x0;
          local_88._M_unused._M_object = (void *)0x0;
          local_88._8_8_ = 0;
          local_88._M_unused._M_object = operator_new(0x38);
          *(dwarf_resolver **)local_88._M_unused._0_8_ = this;
          *(die_object **)((long)local_88._M_unused._0_8_ + 8) = local_68;
          *(Dwarf_Addr *)((long)local_88._M_unused._0_8_ + 0x10) = local_60;
          *(Dwarf_Half *)((long)local_88._M_unused._0_8_ + 0x18) = dwversion;
          *(vector<cpptrace::stacktrace_frame,_std::allocator<cpptrace::stacktrace_frame>_> **)
           ((long)local_88._M_unused._0_8_ + 0x20) = local_58;
          *(undefined1 **)((long)local_88._M_unused._0_8_ + 0x28) = local_50;
          *(die_object **)((long)local_88._M_unused._0_8_ + 0x30) = &local_98;
          pcStack_70 = std::
                       _Function_handler<bool_(const_cpptrace::detail::libdwarf::die_object_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O1/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp:391:21)>
                       ::_M_invoke;
          local_78 = std::
                     _Function_handler<bool_(const_cpptrace::detail::libdwarf::die_object_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O1/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp:391:21)>
                     ::_M_manager;
          walk_die_list(&local_40,
                        (function<bool_(const_cpptrace::detail::libdwarf::die_object_&)> *)&local_88
                       );
          bVar4 = local_48;
          if (local_78 != (code *)0x0) {
            (*local_78)(&local_88,&local_88,__destroy_functor);
            bVar4 = local_48;
          }
        }
        die_object::~die_object(&local_40);
      } while (pDVar1 != (Dwarf_Die)0x0);
      die_object::~die_object(&local_98);
      return;
    }
    type = 0x1965de;
    expression = "cpptrace::detail::libdwarf::die_object::die_object(Dwarf_Debug, Dwarf_Die)";
    signature = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O1/_deps/cpptrace-src/src/symbols/dwarf/dwarf.hpp"
    ;
    uVar3 = 0x42;
    local_98.dbg = (Dwarf_Debug)0x0;
  }
  else {
    type = 0x197823;
    expression = 
    "void cpptrace::detail::libdwarf::dwarf_resolver::get_inlines_info(const die_object &, const die_object &, Dwarf_Addr, Dwarf_Half, std::vector<stacktrace_frame> &)"
    ;
    signature = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/build_O1/_deps/cpptrace-src/src/symbols/dwarf/dwarf_resolver.cpp"
    ;
    uVar3 = 0x178;
  }
  location._8_8_ = 0;
  location.file = (char *)uVar3;
  assert_fail((detail *)0x0,type,expression,signature,location,in_stack_ffffffffffffff58);
}

Assistant:

void get_inlines_info(
            const die_object& cu_die,
            const die_object& die,
            Dwarf_Addr pc,
            Dwarf_Half dwversion,
            std::vector<stacktrace_frame>& inlines
        ) {
            ASSERT(die.get_tag() == DW_TAG_subprogram || die.get_tag() == DW_TAG_inlined_subroutine);
            // get_inlines_info is recursive and recurses into dies with pc ranges matching the pc we're looking for,
            // however, because I wouldn't want anything stack overflowing I'm breaking the recursion out into a loop
            // while looping when we find the target die we need to be able to store a die somewhere that doesn't die
            // at the end of the list traversal, we'll use this as a holder for it
            die_object current_obj_holder(dbg, nullptr);
            optional<std::reference_wrapper<const die_object>> current_die = die;
            while(current_die.has_value()) {
                auto child = current_die.unwrap().get().get_child();
                if(!child) {
                    break;
                }
                optional<std::reference_wrapper<const die_object>> target_die;
                walk_die_list(
                    child,
                    [this, &cu_die, pc, dwversion, &inlines, &target_die, &current_obj_holder] (const die_object& die) {
                        if(die.get_tag() == DW_TAG_inlined_subroutine && die.pc_in_die(cu_die, dwversion, pc)) {
                            const auto name = subprogram_symbol(die, dwversion);
                            auto file_i = die.get_unsigned_attribute(DW_AT_call_file);
                            // TODO: Refactor.... Probably put logic in resolve_filename.
                            if(file_i) {
                                // for dwarf 2, 3, 4, and experimental line table version 0xfe06 1-indexing is used
                                // for dwarf 5 0-indexing is used
                                optional<std::reference_wrapper<line_table_info>> line_table_opt;
                                if(skeleton) {
                                    line_table_opt = skeleton.unwrap().resolver.get_line_table(
                                        skeleton.unwrap().cu_die
                                    );
                                } else {
                                    line_table_opt = get_line_table(cu_die);
                                }
                                if(line_table_opt) {
                                    auto& line_table = line_table_opt.unwrap().get();
                                    if(line_table.version != 5) {
                                        if(file_i.unwrap() == 0) {
                                            file_i.reset(); // 0 means no name to be found
                                        } else {
                                            // decrement to 0-based index
                                            file_i.unwrap()--;
                                        }
                                    }
                                } else {
                                    // silently continue
                                }
                            }
                            std::string file = file_i ? resolve_filename(cu_die, file_i.unwrap()) : "";
                            const auto line = die.get_unsigned_attribute(DW_AT_call_line);
                            const auto col = die.get_unsigned_attribute(DW_AT_call_column);
                            inlines.push_back(stacktrace_frame{
                                0,
                                0, // TODO: Could put an object address here...
                                {static_cast<std::uint32_t>(line.value_or(0))},
                                {static_cast<std::uint32_t>(col.value_or(0))},
                                file,
                                name,
                                true
                            });
                            current_obj_holder = die.clone();
                            target_die = current_obj_holder;
                            return false;
                        } else {
                            return true;
                        }
                    }
                );
                // recursing into the found target as-if by get_inlines_info(cu_die, die, pc, dwversion, inlines);
                current_die = target_die;
            }
        }